

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int get_big_cpu_data_cache_size(int level)

{
  bool bVar1;
  int iVar2;
  int i;
  int in_stack_0000032c;
  int in_stack_00000330;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int local_4;
  
  iVar2 = ncnn::CpuSet::num_enabled
                    ((CpuSet *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  if (iVar2 == 0) {
    local_4 = get_data_cache_size(in_stack_00000330,in_stack_0000032c);
  }
  else {
    for (iVar2 = 0; iVar2 < g_cpucount; iVar2 = iVar2 + 1) {
      bVar1 = ncnn::CpuSet::is_enabled(&g_cpu_affinity_mask_big,iVar2);
      if (bVar1) {
        iVar2 = get_data_cache_size(in_stack_00000330,in_stack_0000032c);
        return iVar2;
      }
    }
    local_4 = get_data_cache_size(in_stack_00000330,in_stack_0000032c);
  }
  return local_4;
}

Assistant:

static int get_big_cpu_data_cache_size(int level)
{
    if (g_cpu_affinity_mask_big.num_enabled() == 0)
    {
        // smp cpu
        return get_data_cache_size(0, level);
    }

    for (int i = 0; i < g_cpucount; i++)
    {
        if (g_cpu_affinity_mask_big.is_enabled(i))
        {
            return get_data_cache_size(i, level);
        }
    }

    // should never reach here, fallback to cpu0
    return get_data_cache_size(0, level);
}